

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

common_init_result * common_init_from_params(common_params *params)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  undefined4 uVar9;
  int iVar10;
  uint uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  common_log *pcVar14;
  undefined8 uVar15;
  float *pfVar16;
  pointer plVar17;
  size_type sVar18;
  int *piVar19;
  unsigned_long *puVar20;
  long in_RSI;
  common_init_result *in_RDI;
  llama_token decoder_start_token_id;
  llama_token eos;
  llama_token bos;
  vector<int,_std::allocator<int>_> tmp;
  llama_token i;
  llama_adapter_lora_ptr lora;
  common_adapter_lora_info *la;
  iterator __end1;
  iterator __begin1;
  vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *__range1;
  int err;
  common_control_vector_data cvec;
  llama_context *lctx;
  llama_context_params cparams;
  bool ok;
  llama_vocab *vocab;
  llama_model *model;
  llama_model_params mparams;
  common_init_result *iparams;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 uVar23;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  llama_token token;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
  *in_stack_fffffffffffffbc8;
  vector<int,_std::allocator<int>_> *this;
  unsigned_long local_308;
  size_type local_300;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e0;
  llama_token lStack_2dc;
  int local_2bc;
  undefined4 local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined4 uStack_2a0;
  llama_token lStack_29c;
  undefined4 local_27c;
  int local_278;
  int local_274;
  vector<int,_std::allocator<int>_> local_270;
  int local_258;
  undefined4 local_254;
  string local_250 [36];
  int local_22c;
  reference local_220;
  common_adapter_lora_info *local_218;
  __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
  local_210;
  long local_208;
  int local_1fc;
  int local_1f8;
  vector<float,_std::allocator<float>_> local_1f0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  long local_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  byte local_d9;
  undefined8 local_d8;
  int local_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  long local_78;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  byte local_11;
  long local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  common_init_result::common_init_result
            ((common_init_result *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  common_model_params_to_llama
            ((common_params *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  uVar13 = std::__cxx11::string::c_str();
  local_88 = local_20;
  local_98 = local_30;
  uStack_90 = uStack_28;
  local_a8 = local_40;
  uStack_a0 = uStack_38;
  local_b8 = local_50;
  uStack_b0 = uStack_48;
  uVar1 = uStack_b0;
  local_c8 = local_60;
  uStack_c0 = uStack_58;
  uVar15 = uStack_c0;
  uStack_c0._0_4_ = (undefined4)uStack_58;
  uStack_c0._4_4_ = (undefined4)((ulong)uStack_58 >> 0x20);
  uStack_b0._0_4_ = (undefined4)uStack_48;
  uStack_b0._4_4_ = (undefined4)((ulong)uStack_48 >> 0x20);
  uVar23 = (undefined4)uStack_c0;
  uVar24 = uStack_c0._4_4_;
  uVar21 = (undefined4)uStack_b0;
  uVar22 = uStack_b0._4_4_;
  uStack_c0 = uVar15;
  uStack_b0 = uVar1;
  local_78 = llama_model_load_from_file(uVar13);
  if (local_78 == 0) {
    if (-1 < common_log_verbosity_thold) {
      pcVar14 = common_log_main();
      uVar15 = std::__cxx11::string::c_str();
      common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s: failed to load model \'%s\'\n",
                     "common_init_from_params",uVar15);
    }
    local_11 = 1;
    local_cc = 1;
  }
  else {
    local_d8 = llama_model_get_vocab(local_78);
    if ((*(byte *)(local_10 + 0x1128) & 1) != 0) {
      local_d9 = 1;
      iVar8 = llama_vocab_bos(local_d8);
      if (iVar8 == -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_WARN,
                         "%s: warning: vocab does not have a  BOS token, reranking will not work\n",
                         "common_init_from_params");
        }
        local_d9 = 0;
      }
      iVar8 = llama_vocab_eos(local_d8);
      if (iVar8 == -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_WARN,
                         "%s: warning: vocab does not have an EOS token, reranking will not work\n",
                         "common_init_from_params");
        }
        local_d9 = 0;
      }
      iVar8 = llama_vocab_sep(local_d8);
      if (iVar8 == -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_WARN,
                         "%s: warning: vocab does not have a  SEP token, reranking will not work\n",
                         "common_init_from_params");
        }
        local_d9 = 0;
      }
      if ((local_d9 & 1) == 0) {
        llama_model_free(local_78);
        local_11 = 1;
        local_cc = 1;
        goto LAB_00167ed9;
      }
    }
    common_context_params_to_llama((common_params *)CONCAT44(uVar22,uVar21));
    local_168 = local_e8;
    local_178 = local_f8;
    uStack_170 = uStack_f0;
    local_188 = local_108;
    uStack_180 = uStack_100;
    local_198 = local_118;
    uStack_190 = uStack_110;
    local_1a8 = local_128;
    uStack_1a0 = uStack_120;
    local_1b8 = local_138;
    uVar3 = local_1b8;
    uStack_1b0 = uStack_130;
    uVar4 = uStack_1b0;
    local_1c8 = local_148;
    uVar13 = local_1c8;
    uStack_1c0 = uStack_140;
    uVar2 = uStack_1c0;
    local_1d8 = local_158;
    uVar15 = local_1d8;
    uStack_1d0 = uStack_150;
    uVar1 = uStack_1d0;
    local_1d8._0_4_ = (undefined4)local_158;
    local_1d8._4_4_ = (undefined4)((ulong)local_158 >> 0x20);
    uStack_1d0._0_4_ = (undefined4)uStack_150;
    uStack_1d0._4_4_ = (undefined4)((ulong)uStack_150 >> 0x20);
    local_1c8._0_4_ = (undefined4)local_148;
    local_1c8._4_4_ = (undefined4)((ulong)local_148 >> 0x20);
    uStack_1c0._0_4_ = (undefined4)uStack_140;
    uStack_1c0._4_4_ = (llama_token)((ulong)uStack_140 >> 0x20);
    local_1b8._0_4_ = (undefined4)local_138;
    local_1b8._4_4_ = (undefined4)((ulong)local_138 >> 0x20);
    uStack_1b0._0_4_ = (undefined4)uStack_130;
    uStack_1b0._4_4_ = (undefined4)((ulong)uStack_130 >> 0x20);
    uVar21 = (undefined4)local_1d8;
    uVar22 = local_1d8._4_4_;
    uVar23 = (undefined4)uStack_1d0;
    uVar24 = uStack_1d0._4_4_;
    uVar25 = (undefined4)local_1c8;
    uVar26 = local_1c8._4_4_;
    uVar27 = (undefined4)uStack_1c0;
    token = uStack_1c0._4_4_;
    uVar12 = (undefined4)local_1b8;
    uVar28 = local_1b8._4_4_;
    uVar29 = (undefined4)uStack_1b0;
    uVar30 = uStack_1b0._4_4_;
    local_1d8 = uVar15;
    uStack_1d0 = uVar1;
    local_1c8 = uVar13;
    uStack_1c0 = uVar2;
    local_1b8 = uVar3;
    uStack_1b0 = uVar4;
    local_160 = llama_init_from_model(local_78);
    if (local_160 == 0) {
      if (-1 < common_log_verbosity_thold) {
        pcVar14 = common_log_main();
        uVar15 = std::__cxx11::string::c_str();
        common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,
                       "%s: failed to create context with model \'%s\'\n","common_init_from_params",
                       uVar15);
      }
      llama_model_free(local_78);
      local_11 = 1;
      local_cc = 1;
    }
    else {
      if (((*(byte *)(local_10 + 0x1027) & 1) != 0) &&
         (bVar6 = llama_kv_self_can_shift(local_160), (bVar6 & 1) == 0)) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_WARN,
                         "%s: KV cache shifting is not supported for this context, disabling KV cache shifting\n"
                         ,"common_init_from_params");
        }
        *(undefined1 *)(local_10 + 0x1027) = 0;
      }
      bVar7 = std::
              vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
              ::empty((vector<common_control_vector_load_info,_std::allocator<common_control_vector_load_info>_>
                       *)CONCAT44(token,uVar27));
      if (!bVar7) {
        if (*(int *)(local_10 + 0xfdc) < 1) {
          *(undefined4 *)(local_10 + 0xfdc) = 1;
        }
        if (*(int *)(local_10 + 0xfe0) < 1) {
          uVar9 = llama_model_n_layer(local_78);
          *(undefined4 *)(local_10 + 0xfe0) = uVar9;
        }
        common_control_vector_load(in_stack_fffffffffffffbc8);
        lVar5 = local_160;
        if (local_1f8 == -1) {
          llama_free(local_160);
          llama_model_free(local_78);
          local_11 = 1;
          local_cc = 1;
        }
        else {
          pfVar16 = std::vector<float,_std::allocator<float>_>::data
                              ((vector<float,_std::allocator<float>_> *)0x16744a);
          sVar18 = std::vector<float,_std::allocator<float>_>::size(&local_1f0);
          local_1fc = llama_apply_adapter_cvec
                                (lVar5,pfVar16,sVar18,local_1f8,*(undefined4 *)(local_10 + 0xfdc),
                                 *(undefined4 *)(local_10 + 0xfe0));
          if (local_1fc == 0) {
            local_cc = 0;
          }
          else {
            llama_free(local_160);
            llama_model_free(local_78);
            local_11 = 1;
            local_cc = 1;
          }
        }
        common_control_vector_data::~common_control_vector_data
                  ((common_control_vector_data *)0x167500);
        if (local_cc != 0) goto LAB_00167ed9;
      }
      local_208 = local_10 + 0xfa8;
      local_210._M_current =
           (common_adapter_lora_info *)
           std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::begin
                     ((vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *
                      )CONCAT44(uVar22,uVar21));
      local_218 = (common_adapter_lora_info *)
                  std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::
                  end((vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *
                      )CONCAT44(uVar22,uVar21));
      while (bVar7 = __gnu_cxx::operator!=
                               ((__normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
                                 *)CONCAT44(uVar24,uVar23),
                                (__normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
                                 *)CONCAT44(uVar22,uVar21)), bVar7) {
        local_220 = __gnu_cxx::
                    __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
                    ::operator*(&local_210);
        std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>::
        unique_ptr<llama_adapter_lora_deleter,void>
                  ((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)
                   CONCAT44(uVar24,uVar23));
        lVar5 = local_78;
        uVar15 = std::__cxx11::string::c_str();
        llama_adapter_lora_init(lVar5,uVar15);
        std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>::reset
                  ((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)
                   CONCAT44(uVar24,uVar23),(pointer)CONCAT44(uVar22,uVar21));
        bVar7 = std::operator==((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)
                                CONCAT44(uVar24,uVar23),(nullptr_t)CONCAT44(uVar22,uVar21));
        if (bVar7) {
          if (-1 < common_log_verbosity_thold) {
            pcVar14 = common_log_main();
            uVar15 = std::__cxx11::string::c_str();
            common_log_add(pcVar14,GGML_LOG_LEVEL_ERROR,"%s: failed to apply lora adapter \'%s\'\n",
                           "common_init_from_params",uVar15);
          }
          llama_free(local_160);
          llama_model_free(local_78);
          local_11 = 1;
          local_cc = 1;
        }
        else {
          plVar17 = std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>::get
                              ((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)
                               CONCAT44(uVar24,uVar23));
          local_220->ptr = plVar17;
          std::
          vector<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>,std::allocator<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>>
          ::emplace_back<std::unique_ptr<llama_adapter_lora,llama_adapter_lora_deleter>>
                    ((vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
                      *)CONCAT44(token,uVar27),
                     (unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)
                     CONCAT44(uVar26,uVar25));
          local_cc = 0;
        }
        std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>::~unique_ptr
                  ((unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter> *)
                   CONCAT44(token,uVar27));
        if (local_cc != 0) goto LAB_00167ed9;
        __gnu_cxx::
        __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
        ::operator++(&local_210);
      }
      if ((*(byte *)(local_10 + 4000) & 1) == 0) {
        common_set_adapter_lora
                  ((llama_context *)CONCAT44(uVar30,uVar29),
                   (vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *)
                   CONCAT44(uVar28,uVar12));
      }
      if (((*(byte *)(local_10 + 0x724) & 1) != 0) &&
         (iVar8 = llama_vocab_eos(local_d8), iVar8 == -1)) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_WARN,
                         "%s: warning: vocab does not have an EOS token, ignoring --ignore-eos\n",
                         "common_init_from_params");
        }
        *(undefined1 *)(local_10 + 0x724) = 0;
      }
      if ((*(byte *)(local_10 + 0x724) & 1) != 0) {
        for (local_22c = 0; iVar8 = local_22c, iVar10 = llama_vocab_n_tokens(local_d8),
            iVar8 < iVar10; local_22c = local_22c + 1) {
          bVar6 = llama_vocab_is_eog(local_d8,local_22c);
          if ((bVar6 & 1) != 0) {
            if (-1 < common_log_verbosity_thold) {
              pcVar14 = common_log_main();
              common_token_to_piece_abi_cxx11_
                        ((llama_context *)CONCAT44(uVar28,uVar12),token,
                         SUB41((uint)uVar27 >> 0x18,0));
              uVar15 = std::__cxx11::string::c_str();
              common_log_add(0,(ggml_log_level)pcVar14,(char *)0x2,"%s: added %s logit bias = %f\n",
                             "common_init_from_params",uVar15);
              std::__cxx11::string::~string(local_250);
            }
            local_258 = local_22c;
            local_254 = 0xff800000;
            std::vector<llama_logit_bias,_std::allocator<llama_logit_bias>_>::push_back
                      ((vector<llama_logit_bias,_std::allocator<llama_logit_bias>_> *)
                       CONCAT44(uVar24,uVar23),(value_type *)CONCAT44(uVar22,uVar21));
          }
        }
      }
      if (*(int *)(local_10 + 0x6f4) == -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          uVar11 = llama_n_ctx(local_160);
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,"%s: setting penalty_last_n to ctx_size = %d\n"
                         ,"common_init_from_params",(ulong)uVar11);
        }
        uVar12 = llama_n_ctx(local_160);
        *(undefined4 *)(local_10 + 0x6f4) = uVar12;
      }
      if (*(int *)(local_10 + 0x710) == -1) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          uVar11 = llama_n_ctx(local_160);
          common_log_add(pcVar14,GGML_LOG_LEVEL_INFO,
                         "%s: setting dry_penalty_last_n to ctx_size = %d\n",
                         "common_init_from_params",(ulong)uVar11);
        }
        uVar12 = llama_n_ctx(local_160);
        *(undefined4 *)(local_10 + 0x710) = uVar12;
      }
      if ((*(byte *)(local_10 + 0x1030) & 1) != 0) {
        if (-1 < common_log_verbosity_thold) {
          pcVar14 = common_log_main();
          common_log_add(pcVar14,GGML_LOG_LEVEL_WARN,
                         "%s: warming up the model with an empty run - please wait ... (--no-warmup to disable)\n"
                         ,"common_init_from_params");
        }
        llama_set_warmup(local_160,1);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)0x167b3f);
        local_274 = llama_vocab_bos(local_d8);
        local_278 = llama_vocab_eos(local_d8);
        if (local_274 != -1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(token,uVar27),
                     (value_type_conflict5 *)CONCAT44(uVar26,uVar25));
        }
        if (local_278 != -1) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(token,uVar27),
                     (value_type_conflict5 *)CONCAT44(uVar26,uVar25));
        }
        bVar7 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)CONCAT44(token,uVar27));
        if (bVar7) {
          local_27c = 0;
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(uVar24,uVar23),
                     (value_type_conflict5 *)CONCAT44(uVar22,uVar21));
        }
        bVar6 = llama_model_has_encoder(local_78);
        lVar5 = local_160;
        if ((bVar6 & 1) != 0) {
          this = &local_270;
          piVar19 = std::vector<int,_std::allocator<int>_>::data
                              ((vector<int,_std::allocator<int>_> *)0x167c75);
          sVar18 = std::vector<int,_std::allocator<int>_>::size(this);
          llama_batch_get_one(&local_2b8,piVar19,sVar18 & 0xffffffff);
          llama_encode(lVar5);
          local_2bc = llama_model_decoder_start_token(local_78);
          if (local_2bc == -1) {
            local_2bc = local_274;
          }
          std::vector<int,_std::allocator<int>_>::clear
                    ((vector<int,_std::allocator<int>_> *)0x167d35);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)CONCAT44(lStack_29c,uStack_2a0),
                     (value_type_conflict5 *)CONCAT44(uStack_2a4,local_2a8));
          uVar21 = local_2b8;
          uVar22 = uStack_2b4;
          uVar23 = uStack_2b0;
          uVar24 = uStack_2ac;
          uVar27 = uStack_2a0;
          token = lStack_29c;
        }
        bVar6 = llama_model_has_decoder(local_78);
        lVar5 = local_160;
        if ((bVar6 & 1) != 0) {
          piVar19 = std::vector<int,_std::allocator<int>_>::data
                              ((vector<int,_std::allocator<int>_> *)0x167d99);
          local_300 = std::vector<int,_std::allocator<int>_>::size(&local_270);
          local_308 = (unsigned_long)*(int *)(local_10 + 8);
          puVar20 = std::min<unsigned_long>(&local_300,&local_308);
          llama_batch_get_one(&local_2f8,piVar19,(int)*puVar20);
          llama_decode(lVar5);
          uVar21 = local_2f8;
          uVar22 = uStack_2f4;
          uVar23 = uStack_2f0;
          uVar24 = uStack_2ec;
          uVar27 = uStack_2e0;
          token = lStack_2dc;
        }
        llama_kv_self_clear(local_160);
        llama_synchronize(local_160);
        llama_perf_context_reset(local_160);
        llama_set_warmup(local_160,0);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(token,uVar27));
      }
      std::unique_ptr<llama_model,_llama_model_deleter>::reset
                ((unique_ptr<llama_model,_llama_model_deleter> *)CONCAT44(uVar24,uVar23),
                 (pointer)CONCAT44(uVar22,uVar21));
      std::unique_ptr<llama_context,_llama_context_deleter>::reset
                ((unique_ptr<llama_context,_llama_context_deleter> *)CONCAT44(uVar24,uVar23),
                 (pointer)CONCAT44(uVar22,uVar21));
      local_11 = 1;
      local_cc = 1;
    }
  }
LAB_00167ed9:
  if ((local_11 & 1) == 0) {
    common_init_result::~common_init_result((common_init_result *)CONCAT44(uVar24,uVar23));
  }
  return in_RDI;
}

Assistant:

struct common_init_result common_init_from_params(common_params & params) {
    common_init_result iparams;
    auto mparams = common_model_params_to_llama(params);

    llama_model * model = llama_model_load_from_file(params.model.path.c_str(), mparams);
    if (model == NULL) {
        LOG_ERR("%s: failed to load model '%s'\n", __func__, params.model.path.c_str());
        return iparams;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    if (params.reranking) {
        bool ok = true;

        if (llama_vocab_bos(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have a  BOS token, reranking will not work\n", __func__);
            ok = false;
        }

        if (llama_vocab_eos(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have an EOS token, reranking will not work\n", __func__);
            ok = false;
        }

        if (llama_vocab_sep(vocab) == LLAMA_TOKEN_NULL) {
            LOG_WRN("%s: warning: vocab does not have a  SEP token, reranking will not work\n", __func__);
            ok = false;
        }

        if (!ok) {
            llama_model_free(model);

            return iparams;
        }
    }

    auto cparams = common_context_params_to_llama(params);

    llama_context * lctx = llama_init_from_model(model, cparams);
    if (lctx == NULL) {
        LOG_ERR("%s: failed to create context with model '%s'\n", __func__, params.model.path.c_str());
        llama_model_free(model);
        return iparams;
    }

    if (params.ctx_shift && !llama_kv_self_can_shift(lctx)) {
        LOG_WRN("%s: KV cache shifting is not supported for this context, disabling KV cache shifting\n", __func__);
        params.ctx_shift = false;
    }

    if (!params.control_vectors.empty()) {
        if (params.control_vector_layer_start <= 0) params.control_vector_layer_start = 1;
        if (params.control_vector_layer_end   <= 0) params.control_vector_layer_end   = llama_model_n_layer(model);

        const auto cvec = common_control_vector_load(params.control_vectors);
        if (cvec.n_embd == -1) {
            llama_free(lctx);
            llama_model_free(model);

            return iparams;
        }

        int err = llama_apply_adapter_cvec(
                lctx,
                cvec.data.data(),
                cvec.data.size(),
                cvec.n_embd,
                params.control_vector_layer_start,
                params.control_vector_layer_end);
        if (err) {
            llama_free(lctx);
            llama_model_free(model);

            return iparams;
        }
    }

    // load and optionally apply lora adapters
    for (auto & la : params.lora_adapters) {
        llama_adapter_lora_ptr lora;
        lora.reset(llama_adapter_lora_init(model, la.path.c_str()));
        if (lora == nullptr) {
            LOG_ERR("%s: failed to apply lora adapter '%s'\n", __func__, la.path.c_str());
            llama_free(lctx);
            llama_model_free(model);
            return iparams;
        }

        la.ptr = lora.get();
        iparams.lora.emplace_back(std::move(lora)); // copy to list of loaded adapters
    }

    if (!params.lora_init_without_apply) {
        common_set_adapter_lora(lctx, params.lora_adapters);
    }

    if (params.sampling.ignore_eos && llama_vocab_eos(vocab) == LLAMA_TOKEN_NULL) {
        LOG_WRN("%s: warning: vocab does not have an EOS token, ignoring --ignore-eos\n", __func__);
        params.sampling.ignore_eos = false;
    }

    if (params.sampling.ignore_eos) {
        for (llama_token i = 0; i < llama_vocab_n_tokens(vocab); i++) {
            if (llama_vocab_is_eog(vocab, i)) {
                LOG_INF("%s: added %s logit bias = %f\n", __func__, common_token_to_piece(lctx, i).c_str(), -INFINITY);
                params.sampling.logit_bias.push_back({i, -INFINITY});
            }
        }
    }

    if (params.sampling.penalty_last_n == -1) {
        LOG_INF("%s: setting penalty_last_n to ctx_size = %d\n", __func__, llama_n_ctx(lctx));
        params.sampling.penalty_last_n = llama_n_ctx(lctx);
    }

    if (params.sampling.dry_penalty_last_n == -1) {
        LOG_INF("%s: setting dry_penalty_last_n to ctx_size = %d\n", __func__, llama_n_ctx(lctx));
        params.sampling.dry_penalty_last_n = llama_n_ctx(lctx);
    }

    if (params.warmup) {
        LOG_WRN("%s: warming up the model with an empty run - please wait ... (--no-warmup to disable)\n", __func__);

        llama_set_warmup(lctx, true);

        std::vector<llama_token> tmp;
        llama_token bos = llama_vocab_bos(vocab);
        llama_token eos = llama_vocab_eos(vocab);

        // some models (e.g. T5) don't have a BOS token
        if (bos != LLAMA_TOKEN_NULL) {
            tmp.push_back(bos);
        }
        if (eos != LLAMA_TOKEN_NULL) {
            tmp.push_back(eos);
        }
        if (tmp.empty()) {
            tmp.push_back(0);
        }

        if (llama_model_has_encoder(model)) {
            llama_encode(lctx, llama_batch_get_one(tmp.data(), tmp.size()));
            llama_token decoder_start_token_id = llama_model_decoder_start_token(model);
            if (decoder_start_token_id == LLAMA_TOKEN_NULL) {
                decoder_start_token_id = bos;
            }
            tmp.clear();
            tmp.push_back(decoder_start_token_id);
        }
        if (llama_model_has_decoder(model)) {
            llama_decode(lctx, llama_batch_get_one(tmp.data(), std::min(tmp.size(), (size_t) params.n_batch)));
        }
        llama_kv_self_clear(lctx);
        llama_synchronize(lctx);
        llama_perf_context_reset(lctx);
        llama_set_warmup(lctx, false);
    }

    iparams.model.reset(model);
    iparams.context.reset(lctx);

    return iparams;
}